

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcoll.c
# Opt level: O2

int main(void)

{
  int iVar1;
  ulong in_RAX;
  ulong uStack_8;
  char empty [1];
  
  uStack_8 = in_RAX & 0xffffffffffffff;
  iVar1 = strcmp(empty,"abcde");
  if (-1 < iVar1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcoll.c, line %d - %s\n"
           ,0x20,"strcmp( empty, abcde ) < 0");
  }
  iVar1 = strcmp("abcde",empty);
  if (iVar1 < 1) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/string/strcoll.c, line %d - %s\n"
           ,0x21,"strcmp( abcde, empty ) > 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
    char cmpabcde[] = "abcde";
    char empty[] = "";
    TESTCASE( strcmp( abcde, cmpabcde ) == 0 );
    TESTCASE( strcmp( abcde, abcdx ) < 0 );
    TESTCASE( strcmp( abcdx, abcde ) > 0 );
    TESTCASE( strcmp( empty, abcde ) < 0 );
    TESTCASE( strcmp( abcde, empty ) > 0 );
    return TEST_RESULTS;
}